

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O2

_Bool xdr_opaque_encode(XDR *xdrs,char *cp,u_int cnt)

{
  _Bool _Var1;
  uint32_t zero;
  
  if (cnt == 0) {
    return true;
  }
  _Var1 = (*xdrs->x_ops->x_putbytes)(xdrs,cp,cnt);
  if (_Var1) {
    if ((cnt & 3) == 0) {
      return true;
    }
    zero = 0;
    _Var1 = (*xdrs->x_ops->x_putbytes)(xdrs,(char *)&zero,4 - (cnt & 3));
    if (_Var1) {
      return true;
    }
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR zero","xdr_opaque_encode",0x1f8);
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR opaque","xdr_opaque_encode",0x1e8);
    return false;
  }
  return false;
}

Assistant:

static inline bool
xdr_opaque_encode(XDR *xdrs, const char *cp, u_int cnt)
{
	u_int rndup;

	/*
	 * if no data we are done
	 */
	if (cnt == 0)
		return (true);

	/*
	 * XDR_INLINE is just as likely to do a function call,
	 * so don't bother with it here.
	 */
	if (!XDR_PUTBYTES(xdrs, cp, cnt)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR opaque",
			__func__, __LINE__);
		return (false);
	}

	/*
	 * round byte count to full xdr units
	 */
	rndup = cnt & (BYTES_PER_XDR_UNIT - 1);

	if (rndup > 0) {
		uint32_t zero = 0;

		if (!XDR_PUTBYTES(xdrs, (char *) &zero,
				  BYTES_PER_XDR_UNIT - rndup)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR zero",
				__func__, __LINE__);
			return (false);
		}
	}

	return (true);
}